

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# link.hpp
# Opt level: O3

void diy::Serialization<diy::AMRLink::Description>::load(BinaryBuffer *bb,Description *x)

{
  (*bb->_vptr_BinaryBuffer[4])(bb,x,4);
  Serialization<diy::DynamicPoint<int,_4UL>_>::load(bb,&x->refinement);
  Serialization<diy::DynamicPoint<int,_4UL>_>::load(bb,&(x->core).min);
  Serialization<diy::DynamicPoint<int,_4UL>_>::load(bb,&(x->core).max);
  Serialization<diy::DynamicPoint<int,_4UL>_>::load(bb,&(x->bounds).min);
  Serialization<diy::DynamicPoint<int,_4UL>_>::load(bb,&(x->bounds).max);
  return;
}

Assistant:

static void         load(diy::BinaryBuffer& bb, diy::AMRLink::Description& x)
        {
            diy::load(bb, x.level);
            diy::load(bb, x.refinement);
            diy::load(bb, x.core);
            diy::load(bb, x.bounds);
        }